

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O2

void run_test<cppcms::sessions::impl::aes_factory>(string *name,string *k,bool is_signature)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  char cVar5;
  bool bVar6;
  __type _Var7;
  char cVar8;
  uint uVar9;
  ostream *poVar10;
  runtime_error *prVar11;
  long lVar12;
  pointer *__ptr;
  ulong uVar13;
  undefined1 local_2f8 [8];
  string a_1;
  string a;
  string plain;
  string cipher;
  string b_1;
  ostringstream oss;
  string b;
  string orig_text [2];
  string local_50 [32];
  
  pcVar2 = (k->_M_dataplus)._M_p;
  cVar8 = *pcVar2;
  cVar1 = pcVar2[0x1f];
  cppcms::crypto::key::key((key *)&oss,(string *)k);
  gen<cppcms::sessions::impl::aes_factory>((string *)local_2f8,(key *)name);
  cppcms::crypto::key::~key((key *)&oss);
  auVar3 = local_2f8;
  std::__cxx11::string::string((string *)&oss,"Hello World",(allocator *)orig_text);
  (*(code *)**(undefined8 **)auVar3)(&cipher,auVar3,&oss);
  std::__cxx11::string::~string((string *)&oss);
  plain._M_dataplus._M_p = (pointer)&plain.field_2;
  plain._M_string_length = 0;
  plain.field_2._M_local_buf[0] = '\0';
  cVar5 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&cipher,&plain);
  if (cVar5 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar10 = std::operator<<((ostream *)&oss,"Error ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x25);
    std::operator<<(poVar10," enc->decrypt(cipher,plain)");
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)orig_text);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar6 = std::operator==(&plain,"Hello World");
  if (!bVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar10 = std::operator<<((ostream *)&oss,"Error ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x26);
    std::operator<<(poVar10," plain==\"Hello World\"");
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)orig_text);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)orig_text,"",(allocator *)&oss);
  std::__cxx11::string::string((string *)(orig_text + 1),"x",(allocator *)&a);
  for (lVar12 = 0; auVar3 = local_2f8, lVar12 != 2; lVar12 = lVar12 + 1) {
    (*(code *)**(undefined8 **)local_2f8)((string *)&oss,local_2f8,orig_text + lVar12);
    std::__cxx11::string::operator=((string *)&cipher,(string *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    cVar5 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&cipher,&plain);
    if (cVar5 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar10 = std::operator<<((ostream *)&oss,"Error ");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x2b);
      std::operator<<(poVar10," enc->decrypt(cipher,plain)");
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,(string *)&a);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var7 = std::operator==(&plain,orig_text + lVar12);
    if (!_Var7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar10 = std::operator<<((ostream *)&oss,"Error ");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x2c);
      std::operator<<(poVar10," plain==orig_text[t]");
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,(string *)&a);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (uVar9 = 0; uVar13 = (ulong)uVar9, uVar13 < cipher._M_string_length; uVar9 = uVar9 + 1) {
      cipher._M_dataplus._M_p[uVar13] = cipher._M_dataplus._M_p[uVar13] + -1;
      cVar5 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&cipher,&plain);
      if (cVar5 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar10 = std::operator<<((ostream *)&oss,"Error ");
        poVar10 = std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x30);
        std::operator<<(poVar10," !enc->decrypt(cipher,plain)");
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,(string *)&a);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cipher._M_dataplus._M_p[uVar13] = cipher._M_dataplus._M_p[uVar13] + '\x02';
      cVar5 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&cipher,&plain);
      if (cVar5 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar10 = std::operator<<((ostream *)&oss,"Error ");
        poVar10 = std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x32);
        std::operator<<(poVar10," !enc->decrypt(cipher,plain)");
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,(string *)&a);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cipher._M_dataplus._M_p[uVar13] = cipher._M_dataplus._M_p[uVar13] + -1;
    }
  }
  std::__cxx11::string::string((string *)&oss,"",(allocator *)&a);
  cVar5 = (**(code **)(*(long *)auVar3 + 8))(auVar3,&oss,&plain);
  std::__cxx11::string::~string((string *)&oss);
  if (cVar5 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar10 = std::operator<<((ostream *)&oss,"Error ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x36);
    std::operator<<(poVar10," !enc->decrypt(\"\",plain)");
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)&a);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  a._M_dataplus._M_p = (pointer)&a.field_2;
  std::__cxx11::string::_M_construct((ulong)&a,'@');
  cVar5 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&a,&plain);
  if (cVar5 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar10 = std::operator<<((ostream *)&oss,"Error ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x38);
    std::operator<<(poVar10," !enc->decrypt(a,plain)");
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)&b);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  b._M_dataplus._M_p = (pointer)&b.field_2;
  std::__cxx11::string::_M_construct((ulong)&b,'@');
  cVar5 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&b,&plain);
  auVar3 = local_2f8;
  if (cVar5 != '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar10 = std::operator<<((ostream *)&oss,"Error ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x3a);
    std::operator<<(poVar10," !enc->decrypt(b,plain)");
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar11,(string *)&a_1);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&a_1,"",(allocator *)&b_1);
  (*(code *)**(undefined8 **)auVar3)(&oss,auVar3,&a_1);
  std::__cxx11::string::operator=((string *)&cipher,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&a_1);
  cVar5 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&cipher,&plain);
  if (cVar5 != '\0') {
    bVar6 = std::operator==(&plain,"");
    auVar3 = local_2f8;
    if (bVar6) {
      std::__cxx11::string::string((string *)&a_1,"test",(allocator *)&b_1);
      (*(code *)**(undefined8 **)auVar3)(&oss,auVar3,&a_1);
      std::__cxx11::string::operator=((string *)&cipher,(string *)&oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&a_1);
      *(k->_M_dataplus)._M_p = cVar8 + '\x01';
      cppcms::crypto::key::key((key *)&oss,(string *)k);
      gen<cppcms::sessions::impl::aes_factory>(&a_1,(key *)name);
      _Var4 = a_1._M_dataplus;
      auVar3 = local_2f8;
      a_1._M_dataplus._M_p = (pointer)0x0;
      local_2f8 = (undefined1  [8])_Var4._M_p;
      if (auVar3 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar3 + 0x18))();
        if (a_1._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)a_1._M_dataplus._M_p + 0x18))();
        }
      }
      a_1._M_dataplus._M_p = (pointer)0x0;
      cppcms::crypto::key::~key((key *)&oss);
      cVar5 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&cipher,&plain);
      if (cVar5 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar10 = std::operator<<((ostream *)&oss,"Error ");
        poVar10 = std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x40);
        std::operator<<(poVar10," !enc->decrypt(cipher,plain)");
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,(string *)&a_1);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *(k->_M_dataplus)._M_p = cVar8;
      (k->_M_dataplus)._M_p[0x1f] = cVar1 + '\x01';
      cppcms::crypto::key::key((key *)&oss,(string *)k);
      gen<cppcms::sessions::impl::aes_factory>(&a_1,(key *)name);
      _Var4 = a_1._M_dataplus;
      auVar3 = local_2f8;
      a_1._M_dataplus._M_p = (pointer)0x0;
      local_2f8 = (undefined1  [8])_Var4._M_p;
      if (auVar3 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar3 + 0x18))();
        if (a_1._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)a_1._M_dataplus._M_p + 0x18))();
        }
      }
      a_1._M_dataplus._M_p = (pointer)0x0;
      cppcms::crypto::key::~key((key *)&oss);
      cVar8 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&cipher,&plain);
      if (cVar8 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar10 = std::operator<<((ostream *)&oss,"Error ");
        poVar10 = std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x44);
        std::operator<<(poVar10," !enc->decrypt(cipher,plain)");
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar11,(string *)&a_1);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      (k->_M_dataplus)._M_p[0x1f] = cVar1;
      cppcms::crypto::key::key((key *)&oss,(string *)k);
      gen<cppcms::sessions::impl::aes_factory>(&a_1,(key *)name);
      _Var4 = a_1._M_dataplus;
      auVar3 = local_2f8;
      a_1._M_dataplus._M_p = (pointer)0x0;
      local_2f8 = (undefined1  [8])_Var4._M_p;
      if (auVar3 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auVar3 + 0x18))();
        if (a_1._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)a_1._M_dataplus._M_p + 0x18))();
        }
      }
      a_1._M_dataplus._M_p = (pointer)0x0;
      cppcms::crypto::key::~key((key *)&oss);
      cVar8 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&cipher,&plain);
      if (cVar8 != '\0') {
        bVar6 = std::operator==(&plain,"test");
        if (bVar6) {
          if (is_signature) {
LAB_00107dfe:
            std::__cxx11::string::~string((string *)&b);
            std::__cxx11::string::~string((string *)&a);
            lVar12 = 0x20;
            do {
              std::__cxx11::string::~string
                        ((string *)((long)&orig_text[0]._M_dataplus._M_p + lVar12));
              lVar12 = lVar12 + -0x20;
            } while (lVar12 != -0x20);
            std::__cxx11::string::~string((string *)&plain);
            std::__cxx11::string::~string((string *)&cipher);
            if (local_2f8 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_2f8 + 0x18))();
            }
            return;
          }
          (*(code *)**(undefined8 **)local_2f8)(&oss,local_2f8,&plain);
          (*(code *)**(undefined8 **)local_2f8)(&a_1,local_2f8,&plain);
          bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&oss,&a_1);
          std::__cxx11::string::~string((string *)&a_1);
          std::__cxx11::string::~string((string *)&oss);
          if (!bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
            poVar10 = std::operator<<((ostream *)&oss,"Error ");
            poVar10 = std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x4a);
            std::operator<<(poVar10," enc->encrypt(plain)!=enc->encrypt(plain)");
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar11,(string *)&a_1);
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          cppcms::crypto::key::key((key *)&oss,(string *)k);
          gen<cppcms::sessions::impl::aes_factory>(&a_1,(key *)name);
          _Var4 = a_1._M_dataplus;
          auVar3 = local_2f8;
          a_1._M_dataplus._M_p = (pointer)0x0;
          local_2f8 = (undefined1  [8])_Var4._M_p;
          if (auVar3 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)auVar3 + 0x18))();
            if (a_1._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)a_1._M_dataplus._M_p + 0x18))();
            }
          }
          a_1._M_dataplus._M_p = (pointer)0x0;
          cppcms::crypto::key::~key((key *)&oss);
          (*(code *)**(undefined8 **)local_2f8)(&a_1,local_2f8,&plain);
          cppcms::crypto::key::key((key *)&oss,(string *)k);
          gen<cppcms::sessions::impl::aes_factory>(&b_1,(key *)name);
          _Var4 = b_1._M_dataplus;
          auVar3 = local_2f8;
          b_1._M_dataplus._M_p = (pointer)0x0;
          local_2f8 = (undefined1  [8])_Var4._M_p;
          if (auVar3 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)auVar3 + 0x18))();
            if (b_1._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)b_1._M_dataplus._M_p + 0x18))();
            }
          }
          b_1._M_dataplus._M_p = (pointer)0x0;
          cppcms::crypto::key::~key((key *)&oss);
          (*(code *)**(undefined8 **)local_2f8)(&b_1,local_2f8,&plain);
          bVar6 = std::operator!=(&a_1,&b_1);
          if (!bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
            poVar10 = std::operator<<((ostream *)&oss,"Error ");
            poVar10 = std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x4f);
            std::operator<<(poVar10," a!=b");
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar11,local_50);
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__cxx11::string::assign((char *)&plain);
          cVar8 = (**(code **)(*(long *)local_2f8 + 8))(local_2f8,&a_1,&plain);
          if (cVar8 != '\0') {
            bVar6 = std::operator==(&plain,"test");
            if (bVar6) {
              std::__cxx11::string::~string((string *)&b_1);
              std::__cxx11::string::~string((string *)&a_1);
              goto LAB_00107dfe;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
          poVar10 = std::operator<<((ostream *)&oss,"Error ");
          poVar10 = std::operator<<(poVar10,
                                    "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                                   );
          poVar10 = std::operator<<(poVar10,":");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x51);
          std::operator<<(poVar10," enc->decrypt(a,plain) && plain == \"test\"");
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar11,local_50);
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar10 = std::operator<<((ostream *)&oss,"Error ");
      poVar10 = std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x47);
      std::operator<<(poVar10," enc->decrypt(cipher,plain) && plain==\"test\"");
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar11,(string *)&a_1);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar10 = std::operator<<((ostream *)&oss,"Error ");
  poVar10 = std::operator<<(poVar10,
                            "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                           );
  poVar10 = std::operator<<(poVar10,":");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x3c);
  std::operator<<(poVar10," enc->decrypt(cipher,plain) && plain==\"\"");
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar11,(string *)&a_1);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void run_test(std::string name,std::string k,bool is_signature = false) 
{
	using cppcms::crypto::key;
	char c1=k[0];
	char c2=k[31];
	std::unique_ptr<cppcms::sessions::encryptor> enc = gen<Encryptor>(name,key(k));
	std::string cipher=enc->encrypt("Hello World");
	std::string plain;
	TEST(enc->decrypt(cipher,plain));
	TEST(plain=="Hello World");

	std::string orig_text[2]= { "", "x" };
	for(unsigned t=0;t<2;t++) {
		cipher=enc->encrypt(orig_text[t]);
		TEST(enc->decrypt(cipher,plain));
		TEST(plain==orig_text[t]);

		for(unsigned i=0;i<cipher.size();i++) {
			cipher[i]--;
			TEST(!enc->decrypt(cipher,plain));
			cipher[i]+=2;
			TEST(!enc->decrypt(cipher,plain));
			cipher[i]--;
		}
	}
	TEST(!enc->decrypt("",plain));
	std::string a(64,'\0');
	TEST(!enc->decrypt(a,plain));
	std::string b(64,'\xFF');
	TEST(!enc->decrypt(b,plain));
	cipher=enc->encrypt("");
	TEST(enc->decrypt(cipher,plain) && plain=="");
	cipher=enc->encrypt("test");
	k[0]=c1+1;
	enc = gen<Encryptor>(name,key(k));
	TEST(!enc->decrypt(cipher,plain));
	k[0]=c1;
	k[31]=c2+1;
	enc = gen<Encryptor>(name,key(k));
	TEST(!enc->decrypt(cipher,plain));
	k[31]=c2;
	enc = gen<Encryptor>(name,key(k));
	TEST(enc->decrypt(cipher,plain) && plain=="test");
	// Salt works
	if(!is_signature) {
		TEST(enc->encrypt(plain)!=enc->encrypt(plain));
		enc = gen<Encryptor>(name,key(k));
		std::string a=enc->encrypt(plain);
		enc = gen<Encryptor>(name,key(k));
		std::string b=enc->encrypt(plain);
		TEST(a!=b);
		plain="XX";
		TEST(enc->decrypt(a,plain) && plain == "test");
	}
}